

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

TextureFormat sglr::toTextureFormat(PixelFormat *pixelFmt)

{
  undefined8 in_RAX;
  TextureFormat TVar1;
  TextureFormat extraout_RAX;
  TestError *this;
  TextureFormat *pTVar2;
  ulong uVar3;
  bool bVar4;
  
  TVar1._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  TVar1.order._0_1_ = toTextureFormat(tcu::PixelFormat_const&)::pixelFormatMap;
  if (toTextureFormat(tcu::PixelFormat_const&)::pixelFormatMap == '\0') {
    toTextureFormat();
    TVar1 = extraout_RAX;
  }
  pTVar2 = &toTextureFormat::pixelFormatMap[0].texFmt;
  uVar3 = 0;
  bVar4 = false;
  while ((((pTVar2[-2].order != pixelFmt->redBits || (pTVar2[-2].type != pixelFmt->greenBits)) ||
          (pTVar2[-1].order != pixelFmt->blueBits)) || (pTVar2[-1].type != pixelFmt->alphaBits))) {
    bVar4 = 3 < uVar3;
    uVar3 = uVar3 + 1;
    pTVar2 = pTVar2 + 3;
    if (uVar3 == 5) {
LAB_00821734:
      if (!bVar4) {
        return TVar1;
      }
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Can\'t map pixel format to texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0xb3);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  TVar1 = *pTVar2;
  goto LAB_00821734;
}

Assistant:

tcu::TextureFormat toTextureFormat (const tcu::PixelFormat& pixelFmt)
{
	static const struct
	{
		tcu::PixelFormat	pixelFmt;
		tcu::TextureFormat	texFmt;
	} pixelFormatMap[] =
	{
		{ tcu::PixelFormat(8,8,8,8),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(8,8,8,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(4,4,4,4),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_4444)	},
		{ tcu::PixelFormat(5,5,5,1),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_5551)	},
		{ tcu::PixelFormat(5,6,5,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_SHORT_565)	}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pixelFormatMap); ndx++)
	{
		if (pixelFormatMap[ndx].pixelFmt == pixelFmt)
			return pixelFormatMap[ndx].texFmt;
	}

	TCU_FAIL("Can't map pixel format to texture format");
}